

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O0

Version * ZXing::QRCode::RecommendVersion
                    (ErrorCorrectionLevel ecLevel,CodecMode mode,BitArray *headerBits,
                    BitArray *dataBits)

{
  int numInputBits;
  Version *pVVar1;
  BitArray *in_RCX;
  BitArray *in_RDX;
  undefined4 in_ESI;
  int bitsNeeded;
  Version *provisionalVersion;
  int provisionalBitsNeeded;
  int in_stack_0000129c;
  undefined4 in_stack_ffffffffffffffb8;
  CodecMode in_stack_ffffffffffffffd4;
  ErrorCorrectionLevel in_stack_ffffffffffffffe0;
  
  Version::Model2(in_stack_0000129c);
  numInputBits = CalculateBitsNeeded(in_stack_ffffffffffffffd4,in_RCX,in_RDX,
                                     (Version *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  ChooseVersion(numInputBits,in_stack_ffffffffffffffe0);
  CalculateBitsNeeded(in_stack_ffffffffffffffd4,in_RCX,in_RDX,
                      (Version *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  pVVar1 = ChooseVersion(numInputBits,in_stack_ffffffffffffffe0);
  return pVVar1;
}

Assistant:

static const Version& RecommendVersion(ErrorCorrectionLevel ecLevel, CodecMode mode, const BitArray& headerBits, const BitArray& dataBits)
{
	// Hard part: need to know version to know how many bits length takes. But need to know how many
	// bits it takes to know version. First we take a guess at version by assuming version will be
	// the minimum, 1:
	int provisionalBitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, *Version::Model2(1));
	const Version& provisionalVersion = ChooseVersion(provisionalBitsNeeded, ecLevel);

	// Use that guess to calculate the right version. I am still not sure this works in 100% of cases.
	int bitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, provisionalVersion);
	return ChooseVersion(bitsNeeded, ecLevel);
}